

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  get_libc_version_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_28,local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return 0;
}

Assistant:

int main(){
    std::cout << get_libc_version() << "\n";
    return 0;
}